

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VectorErrorMsg(Parse *pParse,Expr *pExpr)

{
  Parse *in_RSI;
  Parse *in_RDI;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  if (((ulong)in_RSI->db & 0x100000000000) == 0) {
    sqlite3ErrorMsg(in_RDI,"row value misused");
  }
  else {
    sqlite3SubselectError(in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VectorErrorMsg(Parse *pParse, Expr *pExpr){
#ifndef SQLITE_OMIT_SUBQUERY
  if( ExprUseXSelect(pExpr) ){
    sqlite3SubselectError(pParse, pExpr->x.pSelect->pEList->nExpr, 1);
  }else
#endif
  {
    sqlite3ErrorMsg(pParse, "row value misused");
  }
}